

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration.h
# Opt level: O1

bool __thiscall
std::less<spvtools::val::Decoration>::operator()
          (less<spvtools::val::Decoration> *this,Decoration *__x,Decoration *__y)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  
  bVar3 = true;
  if (__y->struct_member_index_ <= __x->struct_member_index_) {
    if (__x->struct_member_index_ <= __y->struct_member_index_) {
      if (__x->dec_type_ < __y->dec_type_) {
        return true;
      }
      if (__x->dec_type_ <= __y->dec_type_) {
        puVar6 = (__x->params_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar1 = (__x->params_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar4 = (__y->params_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (__y->params_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar7 = (long)puVar2 - (long)puVar4;
        puVar5 = (uint *)((long)puVar6 + lVar7);
        if ((long)puVar1 - (long)puVar6 <= lVar7) {
          puVar5 = puVar1;
        }
        while( true ) {
          if (puVar5 == puVar6) {
            return puVar4 != puVar2;
          }
          if (*puVar4 != *puVar6) break;
          puVar6 = puVar6 + 1;
          puVar4 = puVar4 + 1;
        }
        return *puVar6 < *puVar4;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool operator<(const Decoration& rhs) const {
    // Note: Sort by struct_member_index_ first, then type, so look up can be
    // efficient using lower_bound() and upper_bound().
    if (struct_member_index_ < rhs.struct_member_index_) return true;
    if (rhs.struct_member_index_ < struct_member_index_) return false;
    if (dec_type_ < rhs.dec_type_) return true;
    if (rhs.dec_type_ < dec_type_) return false;
    return params_ < rhs.params_;
  }